

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O1

idx_t duckdb::SortKeyBlobOperator::Decode
                (const_data_ptr_t input,Vector *result,idx_t result_idx,bool flip_bytes)

{
  long lVar1;
  uint *puVar2;
  anon_union_16_2_67f50693_for_value *paVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  byte bVar6;
  undefined7 in_register_00000009;
  char *pcVar7;
  ulong uVar8;
  Vector *vector;
  char *pcVar9;
  uint uVar10;
  bool bVar11;
  anon_struct_16_3_d7536bce_for_pointer aVar12;
  
  pdVar4 = result->data;
  bVar11 = (int)CONCAT71(in_register_00000009,flip_bytes) != 0;
  uVar10 = 1;
  if (bVar11) {
    uVar10 = 0xfe;
  }
  bVar6 = 0xff;
  if (!bVar11) {
    bVar6 = 0;
  }
  uVar5 = (ulong)*input;
  if (bVar6 == *input) {
    uVar8 = 0;
    vector = (Vector *)0x0;
  }
  else {
    vector = (Vector *)0x0;
    uVar8 = 0;
    do {
      vector = (Vector *)((long)vector + 1);
      uVar5 = (ulong)(uVar10 == (uint)uVar5);
      lVar1 = uVar8 + uVar5;
      uVar8 = uVar8 + uVar5 + 1;
      uVar5 = (ulong)input[lVar1 + 1];
    } while (bVar6 != input[lVar1 + 1]);
  }
  aVar12 = (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::EmptyString((StringVector *)result,vector,uVar5);
  puVar2 = (uint *)(pdVar4 + result_idx * 0x10);
  paVar3 = (anon_union_16_2_67f50693_for_value *)(pdVar4 + result_idx * 0x10);
  pcVar9 = (paVar3->pointer).prefix;
  paVar3->pointer = aVar12;
  pcVar7 = aVar12.ptr;
  if (aVar12.length < 0xd) {
    pcVar7 = pcVar9;
  }
  if (uVar8 != 0) {
    uVar5 = 0;
    do {
      bVar6 = input[uVar5];
      *pcVar7 = input[uVar5 + (uVar10 == bVar6)] ^ -flip_bytes;
      uVar5 = uVar5 + (uVar10 == bVar6) + 1;
      pcVar7 = pcVar7 + 1;
    } while (uVar5 < uVar8);
  }
  uVar5 = (ulong)*puVar2;
  if (uVar5 < 0xd) {
    switchD_0130b471::default(pcVar9 + uVar5,0,0xc - uVar5);
  }
  else {
    puVar2[1] = **(uint **)(puVar2 + 2);
  }
  return uVar8 + 1;
}

Assistant:

static idx_t Decode(const_data_ptr_t input, Vector &result, idx_t result_idx, bool flip_bytes) {
		auto result_data = FlatVector::GetData<TYPE>(result);
		// scan until we find the delimiter, keeping in mind escapes
		data_t string_delimiter = SortKeyVectorData::STRING_DELIMITER;
		data_t escape_character = SortKeyVectorData::BLOB_ESCAPE_CHARACTER;
		if (flip_bytes) {
			string_delimiter = ~string_delimiter;
			escape_character = ~escape_character;
		}
		idx_t blob_len = 0;
		idx_t pos;
		for (pos = 0; input[pos] != string_delimiter; pos++) {
			blob_len++;
			if (input[pos] == escape_character) {
				// escape character - skip the next byte
				pos++;
			}
		}
		// now allocate the blob data and fill it with the decoded data
		result_data[result_idx] = StringVector::EmptyString(result, blob_len);
		auto str_data = data_ptr_cast(result_data[result_idx].GetDataWriteable());
		for (idx_t input_pos = 0, result_pos = 0; input_pos < pos; input_pos++) {
			if (input[input_pos] == escape_character) {
				// if we encounter an escape character - copy the NEXT byte
				input_pos++;
			}
			if (flip_bytes) {
				str_data[result_pos++] = ~input[input_pos];
			} else {
				str_data[result_pos++] = input[input_pos];
			}
		}
		result_data[result_idx].Finalize();
		return pos + 1;
	}